

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O1

void GPU_PushMatrix(void)

{
  uint *puVar1;
  uint uVar2;
  GPU_Context *pGVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  GPU_Target *pGVar16;
  float **ppfVar17;
  float *pfVar18;
  ulong uVar19;
  bool bVar20;
  
  pGVar16 = GPU_GetContextTarget();
  if ((pGVar16 != (GPU_Target *)0x0) && (pGVar3 = pGVar16->context, pGVar3 != (GPU_Context *)0x0)) {
    bVar20 = pGVar3->matrix_mode == 0;
    uVar2 = (&pGVar3->projection_matrix)[bVar20].storage_size;
    if (uVar2 <= (&pGVar3->projection_matrix)[bVar20].size + 1) {
      uVar2 = uVar2 * 2 + 4;
      ppfVar17 = (float **)SDL_malloc((ulong)uVar2 * 8);
      if (uVar2 != 0) {
        uVar19 = 0;
        do {
          pfVar18 = (float *)SDL_malloc(0x40);
          ppfVar17[uVar19] = pfVar18;
          uVar19 = uVar19 + 1;
        } while (uVar2 != uVar19);
      }
      if ((&pGVar3->projection_matrix)[bVar20].size != 0) {
        uVar19 = 0;
        do {
          pfVar18 = ppfVar17[uVar19];
          pfVar4 = (&pGVar3->projection_matrix)[bVar20].matrix[uVar19];
          fVar5 = *pfVar4;
          fVar6 = pfVar4[1];
          fVar7 = pfVar4[2];
          fVar8 = pfVar4[3];
          uVar9 = *(undefined8 *)(pfVar4 + 4);
          uVar10 = *(undefined8 *)(pfVar4 + 6);
          uVar11 = *(undefined8 *)(pfVar4 + 8);
          uVar12 = *(undefined8 *)(pfVar4 + 10);
          uVar13 = *(undefined8 *)(pfVar4 + 0xe);
          *(undefined8 *)(pfVar18 + 0xc) = *(undefined8 *)(pfVar4 + 0xc);
          *(undefined8 *)(pfVar18 + 0xe) = uVar13;
          *(undefined8 *)(pfVar18 + 8) = uVar11;
          *(undefined8 *)(pfVar18 + 10) = uVar12;
          *(undefined8 *)(pfVar18 + 4) = uVar9;
          *(undefined8 *)(pfVar18 + 6) = uVar10;
          *pfVar18 = fVar5;
          pfVar18[1] = fVar6;
          pfVar18[2] = fVar7;
          pfVar18[3] = fVar8;
          uVar19 = uVar19 + 1;
        } while (uVar19 < (&pGVar3->projection_matrix)[bVar20].size);
      }
      if ((&pGVar3->projection_matrix)[bVar20].storage_size != 0) {
        uVar19 = 0;
        do {
          SDL_free((&pGVar3->projection_matrix)[bVar20].matrix[uVar19]);
          uVar19 = uVar19 + 1;
        } while (uVar19 < (&pGVar3->projection_matrix)[bVar20].storage_size);
      }
      SDL_free((&pGVar3->projection_matrix)[bVar20].matrix);
      (&pGVar3->projection_matrix)[bVar20].storage_size = uVar2;
      (&pGVar3->projection_matrix)[bVar20].matrix = ppfVar17;
    }
    ppfVar17 = (&pGVar3->projection_matrix)[bVar20].matrix;
    uVar2 = (&pGVar3->projection_matrix)[bVar20].size;
    pfVar18 = ppfVar17[uVar2];
    pfVar4 = ppfVar17[uVar2 - 1];
    uVar9 = *(undefined8 *)pfVar4;
    uVar10 = *(undefined8 *)(pfVar4 + 2);
    uVar11 = *(undefined8 *)(pfVar4 + 4);
    uVar12 = *(undefined8 *)(pfVar4 + 6);
    uVar13 = *(undefined8 *)(pfVar4 + 8);
    uVar14 = *(undefined8 *)(pfVar4 + 10);
    uVar15 = *(undefined8 *)(pfVar4 + 0xe);
    *(undefined8 *)(pfVar18 + 0xc) = *(undefined8 *)(pfVar4 + 0xc);
    *(undefined8 *)(pfVar18 + 0xe) = uVar15;
    *(undefined8 *)(pfVar18 + 8) = uVar13;
    *(undefined8 *)(pfVar18 + 10) = uVar14;
    *(undefined8 *)(pfVar18 + 4) = uVar11;
    *(undefined8 *)(pfVar18 + 6) = uVar12;
    *(undefined8 *)pfVar18 = uVar9;
    *(undefined8 *)(pfVar18 + 2) = uVar10;
    puVar1 = &(&pGVar3->projection_matrix)[bVar20].size;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void GPU_PushMatrix(void)
{
    GPU_Target* target = GPU_GetContextTarget();
	GPU_MatrixStack* stack;

    if(target == NULL || target->context == NULL)
        return;
    
    stack = (target->context->matrix_mode == GPU_MODELVIEW? &target->context->modelview_matrix : &target->context->projection_matrix);
    if(stack->size + 1 >= stack->storage_size)
    {
        // Grow matrix stack (1, 6, 16, 36, ...)
        
        // Alloc new one
        unsigned int new_storage_size = stack->storage_size*2 + 4;
        float** new_stack = (float**)SDL_malloc(sizeof(float*) * new_storage_size);
        unsigned int i;
        for(i = 0; i < new_storage_size; ++i)
        {
            new_stack[i] = (float*)SDL_malloc(sizeof(float) * 16);
        }
        // Copy old one
        for(i = 0; i < stack->size; ++i)
        {
            GPU_MatrixCopy(new_stack[i], stack->matrix[i]);
        }
        // Free old one
        for(i = 0; i < stack->storage_size; ++i)
        {
            SDL_free(stack->matrix[i]);
        }
        SDL_free(stack->matrix);
        
        // Switch to new one
        stack->storage_size = new_storage_size;
        stack->matrix = new_stack;
    }
    GPU_MatrixCopy(stack->matrix[stack->size], stack->matrix[stack->size-1]);
    stack->size++;
}